

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O1

Var Js::JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ToIntegerFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  uint uVar7;
  undefined1 *puVar8;
  double value;
  uint in_stack_00000010;
  undefined1 *in_stack_00000020;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar7 = callInfo._0_4_;
  if (in_stack_00000010 != uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x18b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d3b507;
    *puVar5 = 0;
  }
  if ((uVar7 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x18b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d3b507;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar7 & 0xffffff) != 2) {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0x18b,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00d3b507;
      *puVar5 = 0;
      if ((uVar7 & 0xffffff) == 2) goto LAB_00d3b42e;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x18c,"(args.Info.Count == 2)","args.Info.Count == 2");
    if (!bVar3) goto LAB_00d3b507;
    *puVar5 = 0;
  }
LAB_00d3b42e:
  BVar4 = JavascriptOperators::IsUndefinedOrNull(in_stack_00000020);
  puVar8 = &DAT_1000000000000;
  if (BVar4 == 0) {
    if (((ulong)in_stack_00000020 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)in_stack_00000020 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00d3b507:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    puVar8 = in_stack_00000020;
    if (((ulong)in_stack_00000020 & 0xffff000000000000) != 0x1000000000000) {
      value = JavascriptConversion::ToInteger_Full(in_stack_00000020,pSVar1);
      pvVar6 = JavascriptNumber::ToVarIntCheck(value,pSVar1);
      return pvVar6;
    }
  }
  return puVar8;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ToIntegerFunction(RecyclableObject * function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        Assert(args.Info.Count == 2);

        Var value = args.Values[1];
        if (JavascriptOperators::IsUndefinedOrNull(value))
        {
            return TaggedInt::ToVarUnchecked(0);
        }
        else if (TaggedInt::Is(value))
        {
            return value;
        }

        return JavascriptNumber::ToVarIntCheck(JavascriptConversion::ToInteger(value, scriptContext), scriptContext);
    }